

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

uint32_t cppnet::FormatLog(char *file,uint32_t line,char *level,char *buf,uint32_t len)

{
  int iVar1;
  uint32_t local_34;
  uint local_30;
  uint32_t size;
  uint32_t curlen;
  uint32_t len_local;
  char *buf_local;
  char *level_local;
  char *pcStack_10;
  uint32_t line_local;
  char *file_local;
  
  size = len;
  _curlen = buf;
  buf_local = level;
  level_local._4_4_ = line;
  pcStack_10 = file;
  local_30 = snprintf(buf,(ulong)len,"[%s|",level);
  local_34 = 0x18;
  GetFormatTime(_curlen + local_30,&local_34,FTU_MILLISECOND);
  local_30 = local_34 + local_30;
  iVar1 = snprintf(_curlen + local_30,(ulong)(size - local_30),"|%s:%d] ",pcStack_10,
                   (ulong)level_local._4_4_);
  return iVar1 + local_30;
}

Assistant:

static uint32_t FormatLog(const char* file, uint32_t line, const char* level, char* buf, uint32_t len) {
    // format level
    uint32_t curlen = snprintf(buf, len, "[%s|", level);

    // format time
    uint32_t size = __format_time_buf_size;
    GetFormatTime(buf + curlen, size);
    curlen += size;

    // format other info
    curlen += snprintf(buf + curlen, len - curlen, "|%s:%d] ", file, line);

    return curlen;
}